

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,MessageLite *default_value)

{
  MessageLite *pMVar1;
  int iVar2;
  Extension *pEVar3;
  undefined4 extraout_var;
  Nonnull<const_char_*> pcVar4;
  undefined1 *v1;
  undefined1 auStack_28 [16];
  
  v1 = auStack_28;
  pEVar3 = FindOrNull(this,number);
  if (pEVar3 == (Extension *)0x0) {
    return default_value;
  }
  if (pEVar3->is_repeated == false) {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  }
  if (pcVar4 != (Nonnull<const_char_*>)0x0) {
    GetMessage();
    goto LAB_00f85aa0;
  }
  if ((byte)(pEVar3->type - 0x13) < 0xee) {
    GetMessage();
LAB_00f85a82:
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)v1,10,"cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE"
                       );
  }
  else {
    v1 = (undefined1 *)
         (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar3->type * 4);
    if (v1 != &DAT_0000000a) goto LAB_00f85a82;
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    pMVar1 = (MessageLite *)(pEVar3->field_0).int64_t_value;
    if ((pEVar3->field_0xa & 4) == 0) {
      return pMVar1;
    }
    iVar2 = (*pMVar1->_vptr_MessageLite[3])(pMVar1,default_value,this->arena_);
    return (MessageLite *)CONCAT44(extraout_var,iVar2);
  }
LAB_00f85aa0:
  GetMessage();
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(
    int number, const MessageLite& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      return extension->ptr.lazymessage_value->GetMessage(default_value,
                                                          arena_);
    } else {
      return *extension->ptr.message_value;
    }
  }
}